

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_quic_transport.cc
# Opt level: O2

bool __thiscall
MockQuicTransport::ReadHeader
          (MockQuicTransport *this,uint8_t *out_type,ssl_encryption_level_t *out_level,
          size_t *out_len)

{
  ushort uVar1;
  pointer pEVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  size_t *psVar7;
  char *__format;
  ssl_encryption_level_t level;
  FILE *pFVar8;
  Span<unsigned_char> out;
  Span<unsigned_char> out_00;
  Span<unsigned_char> out_01;
  allocator_type local_82;
  uint8_t level_id;
  uint32_t remaining_bytes;
  uint16_t cipher_suite;
  vector<unsigned_char,_std::allocator<unsigned_char>_> read_secret;
  CBS cbs;
  uint8_t header [8];
  
  psVar7 = out_len;
  while( true ) {
    out.size_ = (size_t)psVar7;
    out.data_ = (uchar *)0x8;
    bVar4 = anon_unknown.dwarf_32880::ReadAll
                      ((anon_unknown_dwarf_32880 *)
                       (this->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(BIO *)header,out);
    if (!bVar4) {
      return false;
    }
    cbs.len = 8;
    cbs.data = header;
    iVar5 = CBS_get_u8(&cbs,out_type);
    if ((((iVar5 == 0) || (iVar5 = CBS_get_u8(&cbs,&level_id), iVar5 == 0)) ||
        (iVar5 = CBS_get_u16(&cbs,&cipher_suite), iVar5 == 0)) ||
       ((iVar5 = CBS_get_u32(&cbs,&remaining_bytes), pFVar8 = _stderr, iVar5 == 0 ||
        (pEVar2 = (this->read_levels_).
                  super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (ulong)((long)(this->read_levels_).
                      super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 5) <=
        (ulong)level_id)))) {
      fwrite("Error parsing record header.\n",0x1d,1,_stderr);
      return false;
    }
    uVar3 = (ulong)level_id;
    uVar1 = pEVar2[uVar3].cipher;
    psVar7 = (size_t *)(ulong)uVar1;
    level = (ssl_encryption_level_t)level_id;
    if ((level_id == '\0') || (uVar1 != 0)) break;
    if (level_id != ssl_encryption_early_data) {
      pcVar6 = anon_unknown.dwarf_32880::LevelToString(level);
      fprintf(pFVar8,"Got record at level %s, but keys were not configured.\n",pcVar6);
      return false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &read_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
               (ulong)remaining_bytes,&local_82);
    out_00.data_ = read_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
                   -(long)read_secret.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
    out_00.size_ = (size_t)psVar7;
    bVar4 = anon_unknown.dwarf_32880::ReadAll
                      ((anon_unknown_dwarf_32880 *)
                       (this->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                       (BIO *)read_secret.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,out_00);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&read_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (!bVar4) {
      return false;
    }
  }
  if (cipher_suite != uVar1) {
    pcVar6 = anon_unknown.dwarf_32880::LevelToString(level);
    fprintf(pFVar8,"Got cipher suite 0x%04x at level %s, wanted 0x%04x.\n",(ulong)cipher_suite,
            pcVar6,(ulong)uVar1);
    return false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&read_secret,
             (long)*(pointer *)
                    ((long)&pEVar2[uVar3].secret.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl + 8) -
             *(long *)&pEVar2[uVar3].secret.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data,&local_82);
  pFVar8 = _stderr;
  out_01.size_ = (long)*(pointer *)
                        ((long)&pEVar2[uVar3].secret.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl + 8) -
                 *(long *)&pEVar2[uVar3].secret.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data;
  if (remaining_bytes < out_01.size_) {
    pcVar6 = anon_unknown.dwarf_32880::LevelToString(level);
    __format = "Record at level %s too small.\n";
  }
  else {
    remaining_bytes = remaining_bytes - (int)out_01.size_;
    out_01.data_ = read_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
                   -(long)read_secret.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
    bVar4 = anon_unknown.dwarf_32880::ReadAll
                      ((anon_unknown_dwarf_32880 *)
                       (this->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                       (BIO *)read_secret.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,out_01);
    if (!bVar4) {
      fwrite("Error reading record secret.\n",0x1d,1,_stderr);
      bVar4 = false;
      goto LAB_00121d9b;
    }
    bVar4 = std::operator!=(&read_secret,&pEVar2[uVar3].secret);
    pFVar8 = _stderr;
    if (!bVar4) {
      *out_level = (uint)level_id;
      *out_len = (ulong)remaining_bytes;
      bVar4 = true;
      goto LAB_00121d9b;
    }
    pcVar6 = anon_unknown.dwarf_32880::LevelToString(level);
    __format = "Encryption secret at level %s did not match.\n";
  }
  bVar4 = false;
  fprintf(pFVar8,__format,pcVar6);
LAB_00121d9b:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&read_secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar4;
}

Assistant:

bool MockQuicTransport::ReadHeader(uint8_t *out_type,
                                   enum ssl_encryption_level_t *out_level,
                                   size_t *out_len) {
  for (;;) {
    uint8_t header[8];
    if (!ReadAll(bio_.get(), header)) {
      // TODO(davidben): Distinguish between errors and EOF. See
      // ReadApplicationData.
      return false;
    }

    CBS cbs;
    uint8_t level_id;
    uint16_t cipher_suite;
    uint32_t remaining_bytes;
    CBS_init(&cbs, header, sizeof(header));
    if (!CBS_get_u8(&cbs, out_type) ||
        !CBS_get_u8(&cbs, &level_id) ||
        !CBS_get_u16(&cbs, &cipher_suite) ||
        !CBS_get_u32(&cbs, &remaining_bytes) ||
        level_id >= read_levels_.size()) {
      fprintf(stderr, "Error parsing record header.\n");
      return false;
    }

    auto level = static_cast<ssl_encryption_level_t>(level_id);
    // Non-initial levels must be configured before use.
    uint16_t expect_cipher = read_levels_[level].cipher;
    if (expect_cipher == 0 && level != ssl_encryption_initial) {
      if (level == ssl_encryption_early_data) {
        // If we receive early data records without any early data keys, skip
        // the record. This means early data was rejected.
        std::vector<uint8_t> discard(remaining_bytes);
        if (!ReadAll(bio_.get(), bssl::Span(discard))) {
          return false;
        }
        continue;
      }
      fprintf(stderr,
              "Got record at level %s, but keys were not configured.\n",
              LevelToString(level));
      return false;
    }
    if (cipher_suite != expect_cipher) {
      fprintf(stderr, "Got cipher suite 0x%04x at level %s, wanted 0x%04x.\n",
              cipher_suite, LevelToString(level), expect_cipher);
      return false;
    }
    const std::vector<uint8_t> &secret = read_levels_[level].secret;
    std::vector<uint8_t> read_secret(secret.size());
    if (remaining_bytes < secret.size()) {
      fprintf(stderr, "Record at level %s too small.\n", LevelToString(level));
      return false;
    }
    remaining_bytes -= secret.size();
    if (!ReadAll(bio_.get(), bssl::Span(read_secret))) {
      fprintf(stderr, "Error reading record secret.\n");
      return false;
    }
    if (read_secret != secret) {
      fprintf(stderr, "Encryption secret at level %s did not match.\n",
              LevelToString(level));
      return false;
    }
    *out_level = level;
    *out_len = remaining_bytes;
    return true;
  }
}